

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ErfLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_erf(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ErfLayerParams *pEVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_erf(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_erf(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pEVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ErfLayerParams>(arena);
    (this->layer_).erf_ = pEVar2;
  }
  return (ErfLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ErfLayerParams* NeuralNetworkLayer::_internal_mutable_erf() {
  if (!_internal_has_erf()) {
    clear_layer();
    set_has_erf();
    layer_.erf_ = CreateMaybeMessage< ::CoreML::Specification::ErfLayerParams >(GetArenaForAllocation());
  }
  return layer_.erf_;
}